

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O0

void wasm::UniqueNameMapper::uniquify(Expression *curr)

{
  undefined1 local_1d8 [8];
  Walker walker;
  Expression *curr_local;
  
  walker.mapper._120_8_ = curr;
  uniquify::Walker::Walker((Walker *)local_1d8);
  Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::walk
            ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)local_1d8,
             (Expression **)&walker.mapper.otherIndex);
  uniquify::Walker::~Walker((Walker *)local_1d8);
  return;
}

Assistant:

void UniqueNameMapper::uniquify(Expression* curr) {
  struct Walker
    : public ControlFlowWalker<Walker, UnifiedExpressionVisitor<Walker>> {
    UniqueNameMapper mapper;

    static void doPreVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          name = self->mapper.pushLabelName(name);
        }
      });
    }

    static void doPostVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          self->mapper.popLabelName(name);
        }
      });
    }

    void visitExpression(Expression* curr) {
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          name = mapper.sourceToUnique(name);
        }
      });
    }
  };

  Walker walker;
  walker.walk(curr);
}